

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O1

int Sbl_ManTestSat(Sbl_Man_t *p,int iPivot)

{
  Hsh_VecMan_t *pHVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  lit *plVar5;
  ulong uVar6;
  ABC_INT64_T AVar7;
  ABC_INT64_T AVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int *piVar13;
  uint *puVar14;
  abctime *paVar15;
  Vec_Int_t *pVVar16;
  abctime aVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar22;
  char *__format;
  Sbl_Man_t *p_00;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  timespec ts;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar27;
  timespec local_a8;
  uint local_98;
  int local_94;
  uint local_90;
  int local_8c;
  uint local_88;
  uint local_84;
  long local_80;
  int local_78;
  uint local_74;
  ulong local_70;
  Sbl_Man_t *local_68;
  abctime *local_60;
  abctime *local_58;
  abctime *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar21;
  
  iVar9 = clock_gettime(3,&local_a8);
  if (iVar9 < 0) {
    lVar19 = 1;
  }
  else {
    lVar19 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    lVar19 = ((lVar19 >> 7) - (lVar19 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  iVar9 = p->pHash->vMap->nSize;
  p->nTried = p->nTried + 1;
  Sbl_ManClean(p);
  iVar10 = Sbl_ManWindow2(p,iPivot);
  if (iVar10 == 0) {
    if (p->fVeryVerbose != 0) {
      printf("Obj %d: Window with less than %d nodes does not exist.\n",iPivot,(ulong)(uint)p->nVars
            );
    }
    p->nSmallWins = p->nSmallWins + 1;
    return 0;
  }
  pVVar16 = p->vAnds;
  pHVar1 = p->pHash;
  pVVar2 = pHVar1->vTable;
  local_98 = iPivot;
  local_68 = p;
  local_48 = lVar19;
  if (pVVar2->nSize < pHVar1->vMap->nSize) {
    uVar22 = (ulong)(pVVar2->nSize * 2 - 1);
    while( true ) {
      do {
        uVar18 = (uint)uVar22;
        uVar20 = uVar18 + 1;
        uVar21 = (ulong)uVar20;
        uVar24 = uVar22 & 1;
        uVar22 = uVar21;
      } while (uVar24 != 0);
      if (uVar20 < 9) break;
      iVar10 = 5;
      while (uVar20 % (iVar10 - 2U) != 0) {
        uVar11 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar20 < uVar11) goto LAB_007a6612;
      }
    }
LAB_007a6612:
    if (pVVar2->nCap < (int)uVar20) {
      if (pVVar2->pArray == (int *)0x0) {
        piVar13 = (int *)malloc((long)(int)uVar20 << 2);
      }
      else {
        piVar13 = (int *)realloc(pVVar2->pArray,(long)(int)uVar20 << 2);
      }
      pVVar2->pArray = piVar13;
      if (piVar13 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar2->nCap = uVar20;
    }
    if (uVar18 < 0x7fffffff) {
      memset(pVVar2->pArray,0xff,uVar21 << 2);
    }
    pVVar2->nSize = uVar20;
    pVVar2 = pHVar1->vMap;
    if (0 < pVVar2->nSize) {
      pVVar3 = pHVar1->vTable;
      pVVar4 = pHVar1->vData;
      lVar19 = 0;
      do {
        iVar10 = pVVar2->pArray[lVar19];
        if (((long)iVar10 < 0) || (pVVar4->nSize <= iVar10)) goto LAB_007a74d2;
        piVar13 = pVVar4->pArray + iVar10;
        iVar10 = *piVar13;
        (pHVar1->vTemp).nCap = iVar10;
        (pHVar1->vTemp).nSize = iVar10;
        (pHVar1->vTemp).pArray = piVar13 + 2;
        if ((long)iVar10 < 1) {
          uVar18 = 0;
        }
        else {
          uVar22 = 0;
          uVar18 = 0;
          do {
            uVar18 = uVar18 + (&Hsh_VecManHash_s_Primes)[uVar22 % 7] * (piVar13 + 2)[uVar22];
            uVar22 = uVar22 + 1;
          } while ((long)iVar10 != uVar22);
        }
        uVar20 = pVVar3->nSize;
        uVar22 = (ulong)uVar18 % (ulong)uVar20;
        if (((int)uVar22 < 0) || ((int)uVar20 <= (int)uVar22)) goto LAB_007a74d2;
        if (pVVar2->nSize <= lVar19) goto LAB_007a74f1;
        iVar10 = pVVar2->pArray[lVar19];
        if (((long)iVar10 < 0) || (pVVar4->nSize <= iVar10)) goto LAB_007a74d2;
        piVar13 = pVVar3->pArray;
        pVVar4->pArray[(long)iVar10 + 1] = piVar13[uVar22];
        piVar13[uVar22] = (int)lVar19;
        lVar19 = lVar19 + 1;
      } while (lVar19 < pVVar2->nSize);
    }
  }
  uVar18 = pHVar1->vTable->nSize;
  iVar10 = pVVar16->nSize;
  if ((long)iVar10 < 1) {
    uVar20 = 0;
  }
  else {
    uVar22 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + (&Hsh_VecManHash_s_Primes)[uVar22 % 7] * pVVar16->pArray[uVar22];
      uVar22 = uVar22 + 1;
    } while ((long)iVar10 != uVar22);
  }
  uVar22 = (ulong)uVar20 % (ulong)uVar18;
  iVar12 = (int)uVar22;
  if ((iVar12 < 0) || ((int)uVar18 <= iVar12)) {
LAB_007a74d2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  puVar14 = (uint *)(pHVar1->vTable->pArray + uVar22);
  while( true ) {
    uVar18 = *puVar14;
    if ((ulong)uVar18 == 0xffffffff) {
      piVar13 = (int *)0x0;
    }
    else {
      if (((int)uVar18 < 0) || (pHVar1->vMap->nSize <= (int)uVar18)) goto LAB_007a74f1;
      iVar12 = pHVar1->vMap->pArray[uVar18];
      if (((long)iVar12 < 0) || (pHVar1->vData->nSize <= iVar12)) goto LAB_007a74d2;
      piVar13 = pHVar1->vData->pArray + iVar12;
    }
    if (piVar13 == (int *)0x0) break;
    if ((*piVar13 == iVar10) &&
       (iVar12 = bcmp(piVar13 + 2,pVVar16->pArray,(long)*piVar13 << 2), iVar12 == 0))
    goto LAB_007a68f9;
    puVar14 = (uint *)(piVar13 + 1);
  }
  pVVar2 = pHVar1->vMap;
  *puVar14 = pVVar2->nSize;
  uVar18 = pHVar1->vData->nSize;
  if ((uVar18 & 1) != 0) {
    __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecHsh.h"
                  ,0x216,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
  }
  Vec_IntPush(pVVar2,uVar18);
  Vec_IntPush(pHVar1->vData,pVVar16->nSize);
  Vec_IntPush(pHVar1->vData,-1);
  uVar22 = (ulong)(uint)pVVar16->nSize;
  if (0 < pVVar16->nSize) {
    lVar19 = 0;
    do {
      Vec_IntPush(pHVar1->vData,pVVar16->pArray[lVar19]);
      lVar19 = lVar19 + 1;
      uVar22 = (ulong)pVVar16->nSize;
    } while (lVar19 < (long)uVar22);
  }
  if ((uVar22 & 1) != 0) {
    Vec_IntPush(pHVar1->vData,-1);
  }
LAB_007a68f9:
  p_00 = local_68;
  if (iVar9 == local_68->pHash->vMap->nSize) {
    if (local_68->fVeryVerbose != 0) {
      printf("Obj %d: This window was already tried.\n",(ulong)local_98);
    }
    p_00->nHashWins = p_00->nHashWins + 1;
    return 0;
  }
  if (local_68->fVeryVerbose != 0) {
    printf("\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n",(ulong)local_98,
           (ulong)(uint)local_68->vLeaves->nSize,(ulong)(uint)local_68->vAnds->nSize);
  }
  uVar18 = p_00->vLeaves->nSize;
  if ((0x80 < (int)uVar18) || (iVar9 = p_00->vAnds->nSize, p_00->nVars < iVar9)) {
    if (p_00->fVeryVerbose != 0) {
      printf("Obj %d: Encountered window with %d inputs and %d internal nodes.\n",(ulong)local_98,
             (ulong)uVar18,(ulong)(uint)p_00->vAnds->nSize);
    }
    p_00->nLargeWins = p_00->nLargeWins + 1;
    return 0;
  }
  if (iVar9 < 10) {
    if (p_00->fVeryVerbose != 0) {
      puts("Skipping.");
      return 0;
    }
    return 0;
  }
  Sbl_ManComputeCuts(p_00);
  Sbl_ManCreateCnf(p_00);
  if (p_00->fVeryVeryVerbose != 0) {
    uVar20 = sat_solver_nclauses(p_00->pSat);
    uVar18 = p_00->vAnds->nSize;
    iVar9 = p_00->vCutsI1->nSize;
    sat_solver_nclauses(p_00->pSat);
    printf("All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n",
           (ulong)uVar20,(ulong)uVar18,(ulong)(iVar9 - uVar18));
  }
  pVVar16 = p_00->vAssump;
  pVVar16->nSize = 0;
  Vec_IntPush(pVVar16,-1);
  iVar9 = p_00->vAnds->nSize;
  if (iVar9 < p_00->Power2) {
    iVar10 = iVar9 * 2 + 1;
    iVar12 = iVar9;
    do {
      if (iVar9 < 0) goto LAB_007a754e;
      Vec_IntPush(p_00->vAssump,iVar10);
      iVar12 = iVar12 + 1;
      iVar10 = iVar10 + 2;
    } while (iVar12 < p_00->Power2);
  }
  pVVar16 = p_00->vRootVars;
  if (0 < pVVar16->nSize) {
    lVar19 = 0;
    do {
      if (pVVar16->pArray[lVar19] < 0) goto LAB_007a754e;
      Vec_IntPush(p_00->vAssump,pVVar16->pArray[lVar19] * 2);
      lVar19 = lVar19 + 1;
      pVVar16 = p_00->vRootVars;
    } while (lVar19 < pVVar16->nSize);
  }
  local_78 = p_00->vSolInit->nSize + 1;
  local_58 = &p_00->timeSatUnd;
  local_60 = &p_00->timeSatUns;
  local_50 = &p_00->timeSatSat;
  iVar9 = 1;
  local_88 = 0;
  local_90 = 0;
  do {
    uVar27 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    if ((iVar9 == 0) || (uVar18 = local_78 - iVar9, (int)uVar18 < 1)) break;
    local_8c = iVar9;
    if (p_00->fVeryVerbose != 0) {
      printf("Trying to find mapping with %d LUTs.\n",(ulong)uVar18);
    }
    if (((int)uVar18 < 0) || (p_00->vCardVars->nSize <= (int)uVar18)) {
LAB_007a74f1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar9 = p_00->vCardVars->pArray[uVar18];
    if (iVar9 < 0) {
LAB_007a754e:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    if (p_00->vAssump->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *p_00->vAssump->pArray = iVar9 * 2 + 1;
    iVar9 = clock_gettime(3,&local_a8);
    lVar19 = -1;
    local_80 = -1;
    if (-1 < iVar9) {
      local_80 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    AVar7 = (p_00->pSat->stats).conflicts;
    plVar5 = p_00->vAssump->pArray;
    in_stack_ffffffffffffff48 = 0;
    iVar10 = sat_solver_solve(p_00->pSat,plVar5,plVar5 + p_00->vAssump->nSize,(long)p_00->nBTLimit,0
                              ,0,0);
    iVar9 = clock_gettime(3,&local_a8);
    if (-1 < iVar9) {
      lVar19 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
    }
    p_00->timeSat = p_00->timeSat + (lVar19 - local_80);
    AVar8 = (p_00->pSat->stats).conflicts;
    p_00->nRuns = p_00->nRuns + 1;
    if (iVar10 == 1) {
      iVar9 = clock_gettime(3,&local_a8);
      paVar15 = local_50;
      if (iVar9 < 0) {
        lVar19 = -1;
      }
      else {
        lVar19 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
    }
    else if (iVar10 == -1) {
      iVar9 = clock_gettime(3,&local_a8);
      paVar15 = local_60;
      if (iVar9 < 0) {
        lVar19 = -1;
      }
      else {
        lVar19 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
    }
    else {
      iVar9 = clock_gettime(3,&local_a8);
      paVar15 = local_58;
      if (iVar9 < 0) {
        lVar19 = -1;
      }
      else {
        lVar19 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
    }
    local_74 = (int)AVar8 - (int)AVar7;
    *paVar15 = *paVar15 + (lVar19 - local_80);
    local_90 = local_90 + local_74;
    local_88 = local_88 + 1;
    local_84 = 0;
    if (iVar10 == 0) {
      bVar26 = false;
      iVar9 = local_8c;
    }
    else {
      local_94 = iVar10;
      if (iVar10 == 1) {
        if (p_00->fVeryVeryVerbose != 0) {
          if (0 < p_00->vAnds->nSize) {
            lVar19 = 0;
            do {
              if (p_00->pSat->size <= lVar19) goto LAB_007a7510;
              printf("%d",(ulong)(p_00->pSat->model[lVar19] == 1));
              lVar19 = lVar19 + 1;
            } while (lVar19 < p_00->vAnds->nSize);
          }
          putchar(10);
          if (p_00->vAnds->nSize < 1) {
            uVar18 = 0;
          }
          else {
            uVar22 = 0;
            uVar18 = 0;
            do {
              if ((long)p_00->pSat->size <= (long)uVar22) goto LAB_007a7510;
              bVar26 = p_00->pSat->model[uVar22] == 1;
              if (bVar26) {
                printf("%d=%d ",uVar22 & 0xffffffff,(ulong)bVar26);
                uVar18 = uVar18 + 1;
              }
              uVar22 = uVar22 + 1;
            } while ((long)uVar22 < (long)p_00->vAnds->nSize);
          }
          printf("Count = %d\n",(ulong)uVar18);
        }
        iVar10 = local_94;
        p_00->vSolCur->nSize = 0;
        uVar18 = p_00->FirstVar;
        uVar22 = (ulong)uVar18;
        iVar9 = sat_solver_nvars(p_00->pSat);
        if ((int)uVar18 < iVar9) {
          local_70 = 1;
          local_84 = 0;
          uVar24 = uVar22;
          local_40 = uVar22;
          do {
            if ((int)uVar24 < 0) {
LAB_007a7510:
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            iVar9 = (int)uVar22;
            if (p_00->pSat->size <= iVar9) goto LAB_007a7510;
            if (p_00->pSat->model[uVar22] == 1) {
              if (p_00->fVeryVeryVerbose != 0) {
                uVar18 = iVar9 - p_00->FirstVar;
                if (((int)uVar18 < 0) || (p_00->vCutsObj->nSize <= (int)uVar18)) goto LAB_007a74f1;
                iVar12 = p_00->vCutsObj->pArray[uVar18];
                lVar19 = (long)iVar12;
                if ((lVar19 < 0) || (p_00->vAnds->nSize <= iVar12)) goto LAB_007a74f1;
                iVar12 = (int)local_70;
                printf("Cut %3d : Node = %3d %6d  ",local_70,lVar19,
                       (ulong)(uint)p_00->vAnds->pArray[lVar19]);
                local_70 = (ulong)(iVar12 + 1);
              }
              if (p_00->fVeryVeryVerbose != 0) {
                uVar18 = iVar9 - p_00->FirstVar;
                if (((((int)uVar18 < 0) || (p_00->vCutsI1->nSize <= (int)uVar18)) ||
                    (p_00->vCutsI2->nSize <= (int)uVar18)) ||
                   ((p_00->vCutsN1->nSize <= (int)uVar18 ||
                    (local_38 = uVar22, p_00->vCutsN2->nSize <= (int)uVar18)))) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
                }
                uVar22 = p_00->vCutsI1->pArray[uVar18];
                uVar24 = p_00->vCutsI2->pArray[uVar18];
                uVar21 = p_00->vCutsN1->pArray[uVar18];
                uVar6 = p_00->vCutsN2->pArray[uVar18];
                uVar23 = 0;
                printf("{ ");
                iVar9 = 0;
                do {
                  if ((uVar22 >> (uVar23 & 0x3f) & 1) != 0) {
                    printf("i%d ",uVar23 & 0xffffffff);
                    iVar9 = iVar9 + 1;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != 0x40);
                uVar22 = 0;
                do {
                  if ((uVar24 >> (uVar22 & 0x3f) & 1) != 0) {
                    printf("i%d ",(ulong)((uint)uVar22 | 0x40));
                    iVar9 = iVar9 + 1;
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != 0x40);
                putchar(0x20);
                uVar22 = 0;
                do {
                  if ((uVar21 >> (uVar22 & 0x3f) & 1) != 0) {
                    printf("n%d ",uVar22 & 0xffffffff);
                    iVar9 = iVar9 + 1;
                  }
                  uVar24 = local_40;
                  uVar22 = uVar22 + 1;
                } while (uVar22 != 0x40);
                uVar22 = 0;
                do {
                  if ((uVar6 >> (uVar22 & 0x3f) & 1) != 0) {
                    printf("n%d ",(ulong)((uint)uVar22 | 0x40));
                    iVar9 = iVar9 + 1;
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != 0x40);
                puts("};");
                local_84 = local_84 + iVar9;
                uVar22 = local_38;
                p_00 = local_68;
                iVar10 = local_94;
              }
              Vec_IntPush(p_00->vSolCur,(int)uVar22 - p_00->FirstVar);
            }
            uVar22 = uVar22 + 1;
            iVar9 = sat_solver_nvars(p_00->pSat);
          } while ((int)uVar22 < iVar9);
        }
      }
      iVar9 = 0;
      if (iVar10 == 1) {
        if ((p_00->fDelay == 0) || (iVar9 = Sbl_ManEvaluateMapping(p_00,p_00->DelayMax), iVar9 != 0)
           ) {
          pVVar16 = p_00->vSolBest;
          pVVar16->nSize = 0;
          pVVar2 = p_00->vSolCur;
          if (0 < pVVar2->nSize) {
            lVar19 = 0;
            do {
              Vec_IntPush(pVVar16,pVVar2->pArray[lVar19]);
              lVar19 = lVar19 + 1;
            } while (lVar19 < pVVar2->nSize);
          }
          iVar10 = local_94;
          iVar9 = local_8c + 1;
        }
        else {
          if (p_00->fVeryVerbose != 0) {
            printf("Critical path of length (%d) is detected:   ",(ulong)(uint)p_00->vPath->nSize);
            pVVar16 = p_00->vPath;
            if (0 < pVVar16->nSize) {
              uVar22 = 0;
              do {
                if (pVVar16->pArray[uVar22] < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar18 = (uint)pVVar16->pArray[uVar22] >> 1;
                if (p_00->vAnds->nSize <= (int)uVar18) goto LAB_007a74f1;
                printf("%d=%d ",uVar22 & 0xffffffff,(ulong)(uint)p_00->vAnds->pArray[uVar18]);
                uVar22 = uVar22 + 1;
                pVVar16 = p_00->vPath;
              } while ((long)uVar22 < (long)pVVar16->nSize);
            }
            putchar(10);
          }
          plVar5 = p_00->vPath->pArray;
          iVar12 = sat_solver_addclause(p_00->pSat,plVar5,plVar5 + p_00->vPath->nSize);
          iVar9 = local_8c;
          if (iVar12 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x452,"int Sbl_ManTestSat(Sbl_Man_t *, int)");
          }
        }
      }
      if (p_00->fVeryVerbose != 0) {
        __format = "UNDEC ";
        if (iVar10 == 1) {
          __format = "SAT   ";
        }
        if (iVar10 == -1) {
          __format = "UNSAT ";
        }
        printf(__format);
        printf("confl =%8d.    ",(ulong)local_74);
        iVar12 = 3;
        iVar10 = clock_gettime(3,&local_a8);
        lVar25 = -1;
        lVar19 = -1;
        if (-1 < iVar10) {
          lVar19 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        lVar19 = lVar19 - local_80;
        Abc_Print(iVar12,"%s =","Time");
        Abc_Print(iVar12,"%9.2f sec\n",(double)lVar19 / 1000000.0);
        printf("Total ");
        printf("confl =%8d.    ",(ulong)local_90);
        iVar12 = 3;
        iVar10 = clock_gettime(3,&local_a8);
        if (-1 < iVar10) {
          lVar25 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
        }
        lVar25 = lVar25 + local_48;
        Abc_Print(iVar12,"%s =","Time");
        Abc_Print(iVar12,"%9.2f sec\n",(double)lVar25 / 1000000.0);
        if ((local_94 == 1) && (p_00->fVeryVeryVerbose != 0)) {
          printf("LitCount = %d.\n",(ulong)local_84);
        }
        putchar(10);
      }
      bVar26 = local_88 != 10;
      if (!bVar26) {
        p_00->nIterOuts = p_00->nIterOuts + 1;
      }
    }
    uVar27 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  } while (bVar26);
  iVar9 = p_00->vSolBest->nSize;
  if ((0 < iVar9) && (iVar9 < p_00->vSolInit->nSize)) {
    Sbl_ManUpdateMapping(p_00);
    if (p_00->pGia->vEdge1 == (Vec_Int_t *)0x0) {
      uVar18 = Sbl_ManCreateTiming(p_00,p_00->DelayMax);
      iVar9 = 0;
    }
    else {
      uVar18 = Gia_ManEvalEdgeDelay(p_00->pGia);
      iVar9 = Gia_ManEvalEdgeCount(p_00->pGia);
    }
    if (p_00->fVerbose != 0) {
      printf("Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n",
             (ulong)local_98,(ulong)(uint)(p_00->vSolInit->nSize - p_00->vSolBest->nSize),
             (ulong)local_90,(ulong)local_88,(ulong)uVar18,CONCAT44(uVar27,iVar9));
    }
    aVar17 = Abc_Clock();
    p_00->timeTotal = p_00->timeTotal + (aVar17 - p_00->timeStart);
    p_00->nImproved = p_00->nImproved + 1;
    return 2;
  }
  iVar9 = clock_gettime(3,&local_a8);
  if (iVar9 < 0) {
    lVar19 = -1;
  }
  else {
    lVar19 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  p_00->timeTotal = p_00->timeTotal + (lVar19 - p_00->timeStart);
  return 1;
}

Assistant:

int Sbl_ManTestSat( Sbl_Man_t * p, int iPivot )
{
    int fKeepTrying = 1;
    abctime clk = Abc_Clock(), clk2;
    int i, status, Root, Count, StartSol, nConfTotal = 0, nIters = 0;
    int nEntries = Hsh_VecSize( p->pHash );
    p->nTried++;

    Sbl_ManClean( p );

    // compute one window
    Count = Sbl_ManWindow2( p, iPivot );
    if ( Count == 0 )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Window with less than %d nodes does not exist.\n", iPivot, p->nVars );
        p->nSmallWins++;
        return 0;
    }
    Hsh_VecManAdd( p->pHash, p->vAnds );
    if ( nEntries == Hsh_VecSize(p->pHash) )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: This window was already tried.\n", iPivot );
        p->nHashWins++;
        return 0;
    }
    if ( p->fVeryVerbose )
    printf( "\nObj = %6d : Leaf = %2d.  AND = %2d.  Root = %2d.    LUT = %2d.\n", 
        iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds), Vec_IntSize(p->vRoots), Vec_IntSize(p->vNodes) ); 

    if ( Vec_IntSize(p->vLeaves) > 128 || Vec_IntSize(p->vAnds) > p->nVars )
    {
        if ( p->fVeryVerbose )
        printf( "Obj %d: Encountered window with %d inputs and %d internal nodes.\n", iPivot, Vec_IntSize(p->vLeaves), Vec_IntSize(p->vAnds) );
        p->nLargeWins++;
        return 0;
    }
    if ( Vec_IntSize(p->vAnds) < 10 )
    {
        if ( p->fVeryVerbose )
        printf( "Skipping.\n" );
        return 0;
    }

    // derive cuts
    Sbl_ManComputeCuts( p );
    // derive SAT instance
    Sbl_ManCreateCnf( p );

    if ( p->fVeryVeryVerbose )
    printf( "All clauses = %d.  Multi clauses = %d.  Binary clauses = %d.  Other clauses = %d.\n\n", 
        sat_solver_nclauses(p->pSat), Vec_IntSize(p->vAnds), Vec_WrdSize(p->vCutsI1) - Vec_IntSize(p->vAnds), 
        sat_solver_nclauses(p->pSat) - Vec_WrdSize(p->vCutsI1) );

    // create assumptions
    // cardinality
    Vec_IntClear( p->vAssump );
    Vec_IntPush( p->vAssump, -1 );
    // unused variables
    for ( i = Vec_IntSize(p->vAnds); i < p->Power2; i++ )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(i, 1) );
    // root variables
    Vec_IntForEachEntry( p->vRootVars, Root, i )
        Vec_IntPush( p->vAssump, Abc_Var2Lit(Root, 0) );
//    Vec_IntPrint( p->vAssump );

    StartSol = Vec_IntSize(p->vSolInit) + 1;
//    StartSol = 30;
    while ( fKeepTrying && StartSol-fKeepTrying > 0 )
    {
        int Count = 0, LitCount = 0;
        int nConfBef, nConfAft;
        if ( p->fVeryVerbose )
            printf( "Trying to find mapping with %d LUTs.\n", StartSol-fKeepTrying );
    //    for ( i = Vec_IntSize(p->vSolInit)-5; i < nVars; i++ )
    //        Vec_IntPush( p->vAssump, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, i), 1) );
        Vec_IntWriteEntry( p->vAssump, 0, Abc_Var2Lit(Vec_IntEntry(p->vCardVars, StartSol-fKeepTrying), 1) );
        // solve the problem
        clk2 = Abc_Clock();
        nConfBef = (int)p->pSat->stats.conflicts;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vAssump), Vec_IntLimit(p->vAssump), p->nBTLimit, 0, 0, 0 );
        p->timeSat += Abc_Clock() - clk2;
        nConfAft = (int)p->pSat->stats.conflicts;
        nConfTotal += nConfAft - nConfBef;
        nIters++;
        p->nRuns++;
        if ( status == l_True )
            p->timeSatSat += Abc_Clock() - clk2;
        else if ( status == l_False )
            p->timeSatUns += Abc_Clock() - clk2;
        else 
            p->timeSatUnd += Abc_Clock() - clk2;
        if ( status == l_Undef )
            break;
        if ( status == l_True )
        {
            if ( p->fVeryVeryVerbose )
            {
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    printf( "%d", sat_solver_var_value(p->pSat, i) );
                printf( "\n" );
                for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
                    if ( sat_solver_var_value(p->pSat, i) )
                    {
                        printf( "%d=%d ", i, sat_solver_var_value(p->pSat, i) );
                        Count++;
                    }
                printf( "Count = %d\n", Count );
            }
//            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
//                printf( "%d", sat_solver_var_value(p->pSat, i) );
//            printf( "\n" );
            Count = 1;
            Vec_IntClear( p->vSolCur );
            for ( i = p->FirstVar; i < sat_solver_nvars(p->pSat); i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                {
                    if ( p->fVeryVeryVerbose )
                        printf( "Cut %3d : Node = %3d %6d  ", Count++, Vec_IntEntry(p->vCutsObj, i-p->FirstVar), Vec_IntEntry(p->vAnds, Vec_IntEntry(p->vCutsObj, i-p->FirstVar)) );
                    if ( p->fVeryVeryVerbose )
                        LitCount += Sbl_ManFindAndPrintCut( p, i-p->FirstVar );
                    Vec_IntPush( p->vSolCur, i-p->FirstVar );
                }
            //Vec_IntPrint( p->vRootVars );
            //Vec_IntPrint( p->vRoots );
            //Vec_IntPrint( p->vAnds );
            //Vec_IntPrint( p->vLeaves );
        }

//        fKeepTrying = status == l_True ? fKeepTrying + 1 : 0;
        // check the timing
        if ( status == l_True )
        {
            if ( p->fDelay && !Sbl_ManEvaluateMapping(p, p->DelayMax) )
            {
                int iLit, value;
                if ( p->fVeryVerbose )
                {
                    printf( "Critical path of length (%d) is detected:   ", Vec_IntSize(p->vPath) );
                    Vec_IntForEachEntry( p->vPath, iLit, i )
                        printf( "%d=%d ", i, Vec_IntEntry(p->vAnds, Abc_Lit2Var(iLit)) );
                    printf( "\n" );
                }
                // add the clause
                value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vPath), Vec_IntLimit(p->vPath)  );
                assert( value );
            }
            else
            {
                Vec_IntClear( p->vSolBest );
                Vec_IntAppend( p->vSolBest, p->vSolCur );
                fKeepTrying++;
            }
        }
        else
            fKeepTrying = 0;
        if ( p->fVeryVerbose )
        {
            if ( status == l_False )
                printf( "UNSAT " );
            else if ( status == l_True )
                printf( "SAT   " );
            else 
                printf( "UNDEC " );
            printf( "confl =%8d.    ", nConfAft - nConfBef );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );

            printf( "Total " );
            printf( "confl =%8d.    ", nConfTotal );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( p->fVeryVeryVerbose && status == l_True )
                printf( "LitCount = %d.\n", LitCount );
            printf( "\n" );
        }
        if ( nIters == 10 )
        {
            p->nIterOuts++;
            //printf( "Obj %d : Quitting after %d iterations.\n", iPivot, nIters );
            break;
        }
    }

    // update solution
    if ( Vec_IntSize(p->vSolBest) > 0 && Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) )
    {
        int nDelayCur, nEdgesCur = 0;
        Sbl_ManUpdateMapping( p );
        if ( p->pGia->vEdge1 )
        {
            nDelayCur = Gia_ManEvalEdgeDelay( p->pGia );
            nEdgesCur = Gia_ManEvalEdgeCount( p->pGia );
        }
        else
            nDelayCur = Sbl_ManCreateTiming( p, p->DelayMax );
        if ( p->fVerbose )
        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d  Delay = %d  Edges = %4d\n", 
            iPivot, Vec_IntSize(p->vSolInit)-Vec_IntSize(p->vSolBest), nConfTotal, nIters, nDelayCur, nEdgesCur );
        p->timeTotal += Abc_Clock() - p->timeStart;
        p->nImproved++;
        return 2;
    }
    else
    {
//        printf( "Object %5d : Saved %2d nodes  (Conf =%8d)  Iter =%3d\n", iPivot, 0, nConfTotal, nIters );
    }
    p->timeTotal += Abc_Clock() - p->timeStart;
    return 1;
}